

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline_listener.c
# Opt level: O2

void ht_timeline_listener_container_unregister_all_listeners
               (HT_TimelineListenerContainer *container)

{
  ht_mutex_lock(container->mutex);
  _ht_timeline_listener_container_unregister_all_listeners(container);
  ht_mutex_unlock(container->mutex);
  return;
}

Assistant:

static void
_ht_timeline_listener_container_unregister_all_listeners(
        HT_TimelineListenerContainer* container)
{
    size_t i;

    for (i = 0; i < container->entries.size; i++)
    {
        HT_TimelineListenerEntry* entry = &container->entries.data[i];
        if (entry->destroy_cb != NULL)
        {
            entry->destroy_cb(entry->user_data);
        }
    }

    ht_bag_listener_clear(&container->entries);
}